

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  byte *pbVar1;
  sqlite3 *psVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  Table *pTVar6;
  HashElem *pHVar7;
  Table *pTVar8;
  char *pcVar9;
  char *local_48;
  Table *local_40;
  char *local_38;
  
  psVar2 = pParse->db;
  if (((psVar2->mDbFlags & 0x10) == 0) && (iVar5 = sqlite3ReadSchema(pParse), iVar5 != 0)) {
LAB_0013c289:
    pTVar6 = (Table *)0x0;
  }
  else {
    pTVar6 = sqlite3FindTable(psVar2,zName,zDbase);
    if (pTVar6 == (Table *)0x0) {
      if (((pParse->prepFlags & 4) == 0) && ((psVar2->init).busy == '\0')) {
        pHVar7 = findElementWithHash(&psVar2->aModule,zName,(uint *)0x0);
        pTVar6 = (Table *)pHVar7->data;
        if (pTVar6 == (Table *)0x0) {
          iVar5 = sqlite3_strnicmp(zName,"pragma_",7);
          if (iVar5 == 0) {
            pTVar6 = (Table *)sqlite3PragmaVtabRegister(psVar2,zName);
          }
          else {
            pTVar6 = (Table *)0x0;
          }
        }
        bVar4 = true;
        if (pTVar6 != (Table *)0x0) {
          pcVar9 = pTVar6->zName;
          local_48 = (char *)0x0;
          lVar3._0_4_ = pTVar6->tnum;
          lVar3._4_4_ = pTVar6->nTabRef;
          if (lVar3 == 0) {
            psVar2 = pParse->db;
            if (((*(long *)(pcVar9 + 8) == 0) || (*(long *)(pcVar9 + 8) == *(long *)(pcVar9 + 0x10))
                ) && (local_38 = pcVar9, pTVar8 = (Table *)sqlite3DbMallocZero(psVar2,0x68),
                     pTVar8 != (Table *)0x0)) {
              local_40 = pTVar8;
              pcVar9 = sqlite3DbStrDup(psVar2,(char *)pTVar6->aCol);
              pTVar8 = local_40;
              local_40->zName = pcVar9;
              if (pcVar9 != (char *)0x0) {
                *(Table **)&pTVar6->tnum = local_40;
                local_40->nTabRef = 1;
                local_40->eTabType = '\x01';
                local_40->pSchema = psVar2->aDb->pSchema;
                local_40->iPKey = -1;
                pbVar1 = (byte *)((long)&local_40->tabFlags + 1);
                *pbVar1 = *pbVar1 | 0x80;
                pcVar9 = sqlite3DbStrDup(psVar2,pcVar9);
                addModuleArgument(pParse,pTVar8,pcVar9);
                addModuleArgument(pParse,pTVar8,(char *)0x0);
                pcVar9 = sqlite3DbStrDup(psVar2,pTVar8->zName);
                addModuleArgument(pParse,pTVar8,pcVar9);
                iVar5 = vtabCallConstructor(psVar2,pTVar8,(Module *)pTVar6,
                                            *(_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                                              **)(local_38 + 0x10),&local_48);
                pcVar9 = local_48;
                if (iVar5 != 0) {
                  sqlite3ErrorMsg(pParse,"%s",local_48);
                  if (pcVar9 != (char *)0x0) {
                    sqlite3DbFreeNN(psVar2,pcVar9);
                  }
                  sqlite3VtabEponymousTableClear(psVar2,(Module *)pTVar6);
                }
                goto LAB_0013c0f1;
              }
              sqlite3DbFreeNN(psVar2,local_40);
            }
          }
          else {
LAB_0013c0f1:
            pTVar6 = *(Table **)&pTVar6->tnum;
            bVar4 = false;
          }
        }
        if (!bVar4) {
          return pTVar6;
        }
      }
      if ((flags & 2) != 0) goto LAB_0013c289;
      pParse->checkSchema = '\x01';
      pTVar6 = (Table *)0x0;
    }
    else if ((pTVar6->eTabType == '\x01') && ((pParse->prepFlags & 4) != 0)) {
      pTVar6 = (Table *)0x0;
    }
    if (pTVar6 == (Table *)0x0) {
      pcVar9 = "no such view";
      if ((flags & 1) == 0) {
        pcVar9 = "no such table";
      }
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar9,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar9,zDbase,zName);
      }
    }
  }
  return pTVar6;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)==0 && db->init.busy==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        testcase( pMod->pEpoTab==0 );
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)!=0 ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }else{
    assert( HasRowid(p) || p->iPKey<0 );
  }

  return p;
}